

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsChartElement.cpp
# Opt level: O0

void __thiscall KDReports::ChartElement::ChartElement(ChartElement *this,Chart *chart)

{
  ChartElementPrivate *pCVar1;
  QMessageLogger local_48;
  Chart *local_18;
  Chart *chart_local;
  ChartElement *this_local;
  
  local_18 = chart;
  chart_local = (Chart *)this;
  Element::Element(&this->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__ChartElement_001c8168;
  pCVar1 = (ChartElementPrivate *)operator_new(0x28);
  ChartElementPrivate::ChartElementPrivate(pCVar1);
  QSharedDataPointer<KDReports::ChartElementPrivate>::QSharedDataPointer(&this->d,pCVar1);
  pCVar1 = QSharedDataPointer<KDReports::ChartElementPrivate>::operator->(&this->d);
  pCVar1->m_tableModel = (QAbstractItemModel *)0x0;
  QMessageLogger::QMessageLogger
            (&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsChartElement.cpp"
             ,0x51,"KDReports::ChartElement::ChartElement(KDChart::Chart *)");
  QMessageLogger::warning
            ((char *)&local_48,
             "ChartElement: cannot use chart, KD Reports was compiled without KD Chart support");
  return;
}

Assistant:

KDReports::ChartElement::ChartElement(KDChart::Chart *chart)
    : d(new ChartElementPrivate)
{
    d->m_tableModel = nullptr;
#ifdef HAVE_KDCHART
    d->m_chart = chart;
#else
    Q_UNUSED(chart);
    qWarning("ChartElement: cannot use chart, KD Reports was compiled without KD Chart support");
#endif
}